

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  allocator_type local_11;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_11);
  pdVar1 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    pdVar2 = (this->Avg2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      dVar7 = pdVar1[lVar5];
      dVar6 = pdVar2[lVar5] - dVar7 * dVar7;
      dVar7 = 0.0;
      if (0.0 <= dVar6) {
        dVar7 = dVar6;
      }
      pdVar3[lVar5] = dVar7;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> getVariance() const {
      std::vector<RealType> var(Avg_.size());

      for (std::size_t i = 0; i < Avg_.size(); i++) {
        var[i] = (Avg2_[i] - Avg_[i] * Avg_[i]);
        if (var[i] < 0) var[i] = 0;
      }

      return var;
    }